

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::DefinePropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_1UL> *pJVar2;
  Var instance;
  RecyclableObject *pRVar3;
  Var instance_00;
  undefined1 local_60 [8];
  PropertyDescriptor propertyDescriptorValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext != (ScriptContext *)0x0) {
    pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,1ul>,(TTD::NSLogEvents::EventKind)56>
                       (evt);
    instance = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
    if (instance != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(instance);
      if (BVar1 != 0) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
        instance_00 = InflateVarInReplay(executeContext,pJVar2->VarArray[1]);
        if (instance_00 != (Var)0x0) {
          BVar1 = Js::JavascriptOperators::IsObject(instance_00);
          if (BVar1 != 0) {
            pRVar3 = Js::VarTo<Js::RecyclableObject>(instance_00);
            if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              instance_00 = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
            }
            Js::PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_60);
            Js::JavascriptOperators::ToPropertyDescriptor
                      (instance_00,(PropertyDescriptor *)local_60,scriptContext);
            pRVar3 = Js::VarTo<Js::RecyclableObject>(instance);
            Js::JavascriptOperators::DefineOwnPropertyDescriptor
                      (pRVar3,(PropertyId)pJVar2->ScalarArray[0],(PropertyDescriptor *)local_60,true
                       ,scriptContext,PropertyOperation_None);
          }
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void DefinePropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarSingleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarSingleScalarArgumentAction, EventKind::DefinePropertyActionTag>(evt);
            Js::Var object = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(object, ctx);
            Js::Var propertyDescriptor = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(propertyDescriptor, ctx);

            Js::PropertyDescriptor propertyDescriptorValue;
            Js::JavascriptOperators::ToPropertyDescriptor(propertyDescriptor, &propertyDescriptorValue, ctx);

            Js::JavascriptOperators::DefineOwnPropertyDescriptor(Js::VarTo<Js::RecyclableObject>(object), GetPropertyIdItem(action), propertyDescriptorValue, true, ctx);
        }